

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.h
# Opt level: O3

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestPartResult
          (PrettyUnitTestResultPrinter *this,TestPartResult *result)

{
  size_t sVar1;
  int in_ECX;
  internal *this_00;
  char *pcVar2;
  ostream *poVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  string local_58;
  string local_38;
  
  if ((result->type_ != kSuccess) && (result->type_ != kSkip)) {
    Message::Message((Message *)&local_60);
    this_00 = (internal *)(result->file_name_)._M_string_length;
    if (this_00 != (internal *)0x0) {
      this_00 = (internal *)(result->file_name_)._M_dataplus._M_p;
    }
    FormatFileLocation_abi_cxx11_
              (&local_38,this_00,(char *)(ulong)(uint)result->line_number_,in_ECX);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_60._M_head_impl + 0x10),local_38._M_dataplus._M_p,
               local_38._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_60._M_head_impl + 0x10)," ",1);
    if ((ulong)result->type_ < 4) {
      pcVar2 = &DAT_001de228 + *(int *)(&DAT_001de228 + (ulong)result->type_ * 4);
    }
    else {
      pcVar2 = "Unknown result type";
    }
    poVar3 = (ostream *)(local_60._M_head_impl + 0x10);
    sVar1 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar1);
    pcVar2 = (result->message_)._M_dataplus._M_p;
    poVar3 = (ostream *)(local_60._M_head_impl + 0x10);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "(null)";
      sVar1 = 6;
    }
    else {
      sVar1 = strlen(pcVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar1);
    StringStreamToString(&local_58,local_60._M_head_impl);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_60._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
    puts(local_58._M_dataplus._M_p);
    fflush(_stdout);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    fflush(_stdout);
  }
  return;
}

Assistant:

Type type() const { return type_; }